

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxautopr.hpp
# Opt level: O3

SPxId __thiscall soplex::SPxAutoPR<double>::selectEnter(SPxAutoPR<double> *this)

{
  SPxOut *pSVar1;
  ostream *poVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  undefined8 in_RAX;
  undefined4 extraout_var;
  size_t sVar6;
  SPxId SVar7;
  Verbosity old_verbosity;
  undefined8 local_28;
  char *__s;
  int extraout_var_00;
  
  local_28 = in_RAX;
  bVar4 = setActivePricer(this,ENTER);
  if (((bVar4) &&
      (pSVar1 = ((this->super_SPxPricer<double>).thesolver)->spxout, pSVar1 != (SPxOut *)0x0)) &&
     (2 < (int)pSVar1->m_verbosity)) {
    local_28 = CONCAT44(3,pSVar1->m_verbosity);
    (*pSVar1->_vptr_SPxOut[2])();
    pSVar1 = ((this->super_SPxPricer<double>).thesolver)->spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity]," --- active pricer: ",0x14);
    iVar5 = (**this->activepricer->_vptr_SPxPricer)();
    __s = (char *)CONCAT44(extraout_var,iVar5);
    poVar2 = pSVar1->m_streams[pSVar1->m_verbosity];
    if (__s == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar6 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar6);
    }
    cVar3 = (char)pSVar1->m_streams[pSVar1->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar1->m_streams[pSVar1->m_verbosity] + -0x18) +
                    cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    pSVar1 = ((this->super_SPxPricer<double>).thesolver)->spxout;
    (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_28);
  }
  SVar7.super_DataKey.info = (*this->activepricer->_vptr_SPxPricer[0xb])();
  SVar7.super_DataKey.idx = extraout_var_00;
  return (SPxId)SVar7.super_DataKey;
}

Assistant:

SPxId SPxAutoPR<R>::selectEnter()
{
   if(setActivePricer(SPxSolverBase<R>::ENTER))
      SPX_MSG_INFO1((*this->thesolver->spxout),
                    (*this->thesolver->spxout) << " --- active pricer: " << activepricer->getName() << std::endl;)

      return activepricer->selectEnter();
}